

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QAbstractItemView * __thiscall
QAccessibleCalendarWidget::calendarView(QAccessibleCalendarWidget *this)

{
  bool bVar1;
  const_iterator o;
  QObject **ppQVar2;
  long in_FS_OFFSET;
  QObject *child;
  QObjectList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  QObject *local_50;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  calendarWidget((QAccessibleCalendarWidget *)0x7e5214);
  QObject::children((QObject *)0x7e521c);
  local_10.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QObject_*>::begin
                       ((QList<QObject_*> *)
                        CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  o = QList<QObject_*>::end
                ((QList<QObject_*> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  while (bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_10,o), bVar1) {
    ppQVar2 = QList<QObject_*>::const_iterator::operator*(&local_10);
    local_50 = *ppQVar2;
    QObject::objectName();
    Qt::Literals::StringLiterals::operator____L1
              ((char *)local_50,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff97 =
         ::operator==((QString *)local_50,
                      (QLatin1StringView *)
                      CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    QString::~QString((QString *)0x7e52d2);
    if ((in_stack_ffffffffffffff97 & 1) != 0) goto LAB_007e5302;
    QList<QObject_*>::const_iterator::operator++(&local_10);
  }
  local_50 = (QObject *)0x0;
LAB_007e5302:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QAbstractItemView *)local_50;
}

Assistant:

QAbstractItemView *QAccessibleCalendarWidget::calendarView() const
{
    for (QObject *child : calendarWidget()->children()) {
        if (child->objectName() == "qt_calendar_calendarview"_L1)
            return static_cast<QAbstractItemView *>(child);
    }
    return nullptr;
}